

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall
presolve::HPresolve::resetColImpliedBoundsDerivedFromRow(HPresolve *this,HighsInt row)

{
  pointer psVar1;
  set<int,_std::less<int>,_std::allocator<int>_> affectedCols;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_50;
  
  psVar1 = (this->colImplSourceByRow).
           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(size_t *)((long)&psVar1[row]._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
              (&local_50,&psVar1[row]._M_t);
    for (; (_Rb_tree_header *)local_50._M_impl.super__Rb_tree_header._M_header._M_left !=
           &local_50._M_impl.super__Rb_tree_header;
        local_50._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::_Rb_tree_increment(local_50._M_impl.super__Rb_tree_header._M_header._M_left)) {
      resetColImpliedBounds
                (this,local_50._M_impl.super__Rb_tree_header._M_header._M_left[1]._M_color,row);
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_50);
  }
  return;
}

Assistant:

void HPresolve::resetColImpliedBoundsDerivedFromRow(HighsInt row) {
  // reset implied column bounds affected by a modification in a row
  // (removed / added non-zeros, etc.)
  if (colImplSourceByRow[row].empty()) return;
  std::set<HighsInt> affectedCols(colImplSourceByRow[row]);
  for (const HighsInt& col : affectedCols) {
    // set implied bounds to infinite values if they were deduced from the
    // given row
    resetColImpliedBounds(col, row);
  }
}